

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<spirv_cross::Variant,_8UL>::reserve
          (SmallVector<spirv_cross::Variant,_8UL> *this,size_t count)

{
  ulong uVar1;
  Variant *pVVar2;
  Variant *__ptr;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  if (count < 0xaaaaaaaaaaaaaab) {
    uVar1 = this->buffer_capacity;
    if (uVar1 < count) {
      uVar4 = 8;
      if (8 < uVar1) {
        uVar4 = uVar1;
      }
      do {
        uVar1 = uVar4;
        uVar4 = uVar1 * 2;
      } while (uVar1 < count);
      if (uVar1 < 9) {
        pVVar2 = (Variant *)&this->stack_storage;
      }
      else {
        pVVar2 = (Variant *)malloc(uVar1 * 0x18);
        if (pVVar2 == (Variant *)0x0) goto LAB_003884fd;
      }
      __ptr = (this->super_VectorView<spirv_cross::Variant>).ptr;
      if (pVVar2 != __ptr) {
        lVar3 = 0;
        for (uVar4 = 0; uVar4 < (this->super_VectorView<spirv_cross::Variant>).buffer_size;
            uVar4 = uVar4 + 1) {
          Variant::Variant((Variant *)((long)&pVVar2->group + lVar3),
                           (Variant *)
                           ((long)&((this->super_VectorView<spirv_cross::Variant>).ptr)->group +
                           lVar3));
          Variant::~Variant((Variant *)
                            ((long)&((this->super_VectorView<spirv_cross::Variant>).ptr)->group +
                            lVar3));
          lVar3 = lVar3 + 0x18;
        }
        __ptr = (this->super_VectorView<spirv_cross::Variant>).ptr;
      }
      if (__ptr != (Variant *)&this->stack_storage) {
        free(__ptr);
      }
      (this->super_VectorView<spirv_cross::Variant>).ptr = pVVar2;
      this->buffer_capacity = uVar1;
    }
    return;
  }
LAB_003884fd:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}